

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleShadingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::SampleShadingTests::init(SampleShadingTests *this,EVP_PKEY_CTX *ctx)

{
  RenderTarget target;
  Context *pCVar1;
  char *__s;
  TestNode *node;
  TestNode *node_00;
  SampleShadingStateCase *pSVar2;
  MinSampleShadingValueCase *pMVar3;
  TestCase *this_00;
  undefined8 extraout_RAX;
  SampleShadingRenderingCase *pSVar4;
  undefined8 uVar5;
  long lVar6;
  QueryType in_R8D;
  SampleShadingTests *pSVar7;
  allocator<char> local_95;
  int local_94;
  SampleShadingTests *local_90;
  SampleShadingRenderingCase *local_88;
  TestNode *local_80;
  long local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"state_query",
             "State query tests.");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "min_sample_shading","Min sample shading tests.");
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  pSVar2 = (SampleShadingStateCase *)operator_new(0x80);
  anon_unknown_2::SampleShadingStateCase::SampleShadingStateCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"sample_shading_is_enabled",(char *)0x2,
             in_R8D);
  tcu::TestNode::addChild(node,(TestNode *)pSVar2);
  pSVar2 = (SampleShadingStateCase *)operator_new(0x80);
  anon_unknown_2::SampleShadingStateCase::SampleShadingStateCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"sample_shading_get_boolean",(char *)0x0,
             in_R8D);
  tcu::TestNode::addChild(node,(TestNode *)pSVar2);
  pSVar2 = (SampleShadingStateCase *)operator_new(0x80);
  anon_unknown_2::SampleShadingStateCase::SampleShadingStateCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"sample_shading_get_integer",(char *)0x3,
             in_R8D);
  tcu::TestNode::addChild(node,(TestNode *)pSVar2);
  pSVar2 = (SampleShadingStateCase *)operator_new(0x80);
  anon_unknown_2::SampleShadingStateCase::SampleShadingStateCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"sample_shading_get_float",(char *)0x5,
             in_R8D);
  tcu::TestNode::addChild(node,(TestNode *)pSVar2);
  pSVar2 = (SampleShadingStateCase *)operator_new(0x80);
  anon_unknown_2::SampleShadingStateCase::SampleShadingStateCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"sample_shading_get_integer64",
             &DAT_00000004,in_R8D);
  tcu::TestNode::addChild(node,(TestNode *)pSVar2);
  pMVar3 = (MinSampleShadingValueCase *)operator_new(0x80);
  anon_unknown_2::MinSampleShadingValueCase::MinSampleShadingValueCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"min_sample_shading_value_get_boolean",
             (char *)0x0,in_R8D);
  tcu::TestNode::addChild(node,(TestNode *)pMVar3);
  pMVar3 = (MinSampleShadingValueCase *)operator_new(0x80);
  anon_unknown_2::MinSampleShadingValueCase::MinSampleShadingValueCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"min_sample_shading_value_get_integer",
             (char *)0x3,in_R8D);
  tcu::TestNode::addChild(node,(TestNode *)pMVar3);
  pMVar3 = (MinSampleShadingValueCase *)operator_new(0x80);
  anon_unknown_2::MinSampleShadingValueCase::MinSampleShadingValueCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"min_sample_shading_value_get_float",
             (char *)0x5,in_R8D);
  tcu::TestNode::addChild(node,(TestNode *)pMVar3);
  pMVar3 = (MinSampleShadingValueCase *)operator_new(0x80);
  anon_unknown_2::MinSampleShadingValueCase::MinSampleShadingValueCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"min_sample_shading_value_get_integer64",
             &DAT_00000004,in_R8D);
  tcu::TestNode::addChild(node,(TestNode *)pMVar3);
  this_00 = (TestCase *)operator_new(0x78);
  local_90 = this;
  gles31::TestCase::TestCase
            (this_00,(this->super_TestCaseGroup).m_context,"min_sample_shading_value_clamping",
             "test MIN_SAMPLE_SHADING_VALUE clamping");
  (this_00->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e492b8;
  tcu::TestNode::addChild(node,(TestNode *)this_00);
  lVar6 = 8;
  uVar5 = extraout_RAX;
  pSVar7 = local_90;
  local_80 = node_00;
  while (lVar6 != 0x98) {
    pSVar4 = (SampleShadingRenderingCase *)operator_new(0x130);
    pCVar1 = (pSVar7->super_TestCaseGroup).m_context;
    __s = *(char **)((long)&init::targets[0].target + lVar6);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_95);
    std::operator+(&local_70,&local_50,"_color");
    target = *(RenderTarget *)(&UNK_01e49158 + lVar6);
    local_94 = *(int *)(&UNK_01e4915c + lVar6);
    local_78 = lVar6;
    anon_unknown_2::SampleShadingRenderingCase::SampleShadingRenderingCase
              (pSVar4,pCVar1,local_70._M_dataplus._M_p,"Test multiple samples per pixel with color",
               target,local_94,TEST_COLOR);
    tcu::TestNode::addChild(local_80,(TestNode *)pSVar4);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    local_88 = (SampleShadingRenderingCase *)operator_new(0x130);
    pSVar7 = local_90;
    pCVar1 = (local_90->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_95);
    std::operator+(&local_70,&local_50,"_discard");
    pSVar4 = local_88;
    anon_unknown_2::SampleShadingRenderingCase::SampleShadingRenderingCase
              (local_88,pCVar1,local_70._M_dataplus._M_p,"Test multiple samples per pixel with",
               target,local_94,TEST_DISCARD);
    tcu::TestNode::addChild(local_80,(TestNode *)pSVar4);
    std::__cxx11::string::~string((string *)&local_70);
    uVar5 = std::__cxx11::string::~string((string *)&local_50);
    lVar6 = local_78 + 0x10;
  }
  return (int)uVar5;
}

Assistant:

void SampleShadingTests::init (void)
{
	tcu::TestCaseGroup* const stateQueryGroup = new tcu::TestCaseGroup(m_testCtx, "state_query", "State query tests.");
	tcu::TestCaseGroup* const minSamplesGroup = new tcu::TestCaseGroup(m_testCtx, "min_sample_shading", "Min sample shading tests.");

	addChild(stateQueryGroup);
	addChild(minSamplesGroup);

	// .state query
	{
		stateQueryGroup->addChild(new SampleShadingStateCase			(m_context, "sample_shading_is_enabled",				"test SAMPLE_SHADING",						QUERY_ISENABLED));
		stateQueryGroup->addChild(new SampleShadingStateCase			(m_context, "sample_shading_get_boolean",				"test SAMPLE_SHADING",						QUERY_BOOLEAN));
		stateQueryGroup->addChild(new SampleShadingStateCase			(m_context, "sample_shading_get_integer",				"test SAMPLE_SHADING",						QUERY_INTEGER));
		stateQueryGroup->addChild(new SampleShadingStateCase			(m_context, "sample_shading_get_float",					"test SAMPLE_SHADING",						QUERY_FLOAT));
		stateQueryGroup->addChild(new SampleShadingStateCase			(m_context, "sample_shading_get_integer64",				"test SAMPLE_SHADING",						QUERY_INTEGER64));
		stateQueryGroup->addChild(new MinSampleShadingValueCase			(m_context, "min_sample_shading_value_get_boolean",		"test MIN_SAMPLE_SHADING_VALUE",			QUERY_BOOLEAN));
		stateQueryGroup->addChild(new MinSampleShadingValueCase			(m_context, "min_sample_shading_value_get_integer",		"test MIN_SAMPLE_SHADING_VALUE",			QUERY_INTEGER));
		stateQueryGroup->addChild(new MinSampleShadingValueCase			(m_context, "min_sample_shading_value_get_float",		"test MIN_SAMPLE_SHADING_VALUE",			QUERY_FLOAT));
		stateQueryGroup->addChild(new MinSampleShadingValueCase			(m_context, "min_sample_shading_value_get_integer64",	"test MIN_SAMPLE_SHADING_VALUE",			QUERY_INTEGER64));
		stateQueryGroup->addChild(new MinSampleShadingValueClampingCase	(m_context, "min_sample_shading_value_clamping",		"test MIN_SAMPLE_SHADING_VALUE clamping"));
	}

	// .min_sample_count
	{
		static const struct Target
		{
			SampleShadingRenderingCase::RenderTarget	target;
			int											numSamples;
			const char*									name;
		} targets[] =
		{
			{ SampleShadingRenderingCase::TARGET_DEFAULT,			0,	"default_framebuffer"					},
			{ SampleShadingRenderingCase::TARGET_TEXTURE,			2,	"multisample_texture_samples_2"			},
			{ SampleShadingRenderingCase::TARGET_TEXTURE,			4,	"multisample_texture_samples_4"			},
			{ SampleShadingRenderingCase::TARGET_TEXTURE,			8,	"multisample_texture_samples_8"			},
			{ SampleShadingRenderingCase::TARGET_TEXTURE,			16,	"multisample_texture_samples_16"		},
			{ SampleShadingRenderingCase::TARGET_RENDERBUFFER,		2,	"multisample_renderbuffer_samples_2"	},
			{ SampleShadingRenderingCase::TARGET_RENDERBUFFER,		4,	"multisample_renderbuffer_samples_4"	},
			{ SampleShadingRenderingCase::TARGET_RENDERBUFFER,		8,	"multisample_renderbuffer_samples_8"	},
			{ SampleShadingRenderingCase::TARGET_RENDERBUFFER,		16,	"multisample_renderbuffer_samples_16"	},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(targets); ++ndx)
		{
			minSamplesGroup->addChild(new SampleShadingRenderingCase(m_context, (std::string(targets[ndx].name) + "_color").c_str(),	"Test multiple samples per pixel with color",	targets[ndx].target, targets[ndx].numSamples, SampleShadingRenderingCase::TEST_COLOR));
			minSamplesGroup->addChild(new SampleShadingRenderingCase(m_context, (std::string(targets[ndx].name) + "_discard").c_str(),	"Test multiple samples per pixel with",			targets[ndx].target, targets[ndx].numSamples, SampleShadingRenderingCase::TEST_DISCARD));
		}
	}
}